

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O1

void __thiscall Inject::ctor_inject::ctor_inject(ctor_inject *this,type *service1)

{
  int iVar1;
  undefined4 extraout_var;
  undefined **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  char *local_d0;
  unique_id local_c8;
  long local_c0;
  unique_id *local_b8;
  long *local_b0;
  undefined1 local_a8 [8];
  undefined8 local_a0;
  shared_count sStack_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined8 *local_50;
  unique_id **local_48;
  undefined **local_40;
  undefined1 local_38;
  undefined8 *local_30;
  long **local_28;
  
  this->ctor_num = 1;
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x247);
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_00163f10;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  if (service1->px != (element_type *)0x0) {
    iVar1 = (**service1->px->_vptr_service)();
    local_c0 = CONCAT44(extraout_var,iVar1);
    local_c8 = inject::id_of<Inject::impl1>::id();
    local_b8 = &local_c8;
    local_a8[0] = local_c0 == local_c8;
    local_a0 = 0;
    sStack_98.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
    ;
    local_68 = "";
    local_28 = &local_b0;
    local_38 = 0;
    local_40 = &PTR__lazy_ostream_00163f88;
    local_30 = &boost::unit_test::lazy_ostream::inst;
    local_48 = &local_b8;
    local_58 = 0;
    local_60 = &PTR__lazy_ostream_00163f88;
    local_50 = &boost::unit_test::lazy_ostream::inst;
    local_b0 = &local_c0;
    boost::test_tools::tt_detail::report_assertion
              (local_a8,&local_e8,&local_70,0x247,1,2,2,"service1->id()",&local_40,
               "id_of<impl1>::id()",&local_60);
    boost::detail::shared_count::~shared_count(&sStack_98);
    return;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Inject::service>::operator->() const [T = Inject::service]"
               );
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1) {
        ctor_num = 1;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
    }